

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

Pos getLinkedGatewayPos(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src)

{
  float fVar1;
  Pos PVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint x;
  int x_00;
  int iVar11;
  float fVar12;
  Pos dst;
  float y [1089];
  
  PVar2 = getLinkedGatewayChunk(en,sn,seed,src,&dst);
  x = PVar2.x << 4;
  if (en->mc < 0x15) {
    iVar11 = PVar2.z << 4;
    pfVar6 = y;
    mapEndSurfaceHeight(pfVar6,en,sn,x,iVar11,0x10,0x10,1,0x1e);
    mapEndIslandHeight(pfVar6,en,seed,x,iVar11,0x10,0x10,1);
    uVar3 = 0;
    uVar7 = 0;
    do {
      uVar8 = uVar3 | (long)iVar11;
      lVar5 = 0;
      do {
        iVar10 = (int)pfVar6[lVar5];
        if ((0x1d < iVar10) &&
           (uVar9 = (ulong)(uint)(iVar10 * iVar10) +
                    ((int)x + lVar5) * ((int)x + lVar5) + uVar8 * uVar8, uVar7 < uVar9)) {
          dst.x = (int)lVar5 + PVar2.x * 0x10;
          dst.z = (int)uVar8;
          uVar7 = uVar9;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      uVar3 = uVar3 + 1;
      pfVar6 = pfVar6 + 0x10;
    } while (uVar3 != 0x10);
    lVar5 = 0;
    iVar11 = 0;
    do {
      if ((float)iVar11 < y[lVar5]) {
        fVar12 = floorf(y[lVar5]);
        iVar11 = (int)fVar12;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  else {
    dst.x = x | 0xf;
    dst.z = PVar2.z << 4 | 0xf;
    iVar11 = 0;
  }
  x_00 = dst.x + -0x10;
  iVar10 = dst.z + -0x10;
  pfVar6 = y;
  lVar5 = 0;
  memset(pfVar6,0,0x1104);
  mapEndIslandHeight(pfVar6,en,seed,x_00,iVar10,0x21,0x21,1);
  do {
    if ((float)iVar11 < y[lVar5]) {
      fVar12 = floorf(y[lVar5]);
      iVar11 = (int)fVar12;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x441);
  mapEndSurfaceHeight(pfVar6,en,sn,x_00,iVar10,0x21,0x21,1,iVar11);
  mapEndIslandHeight(pfVar6,en,seed,x_00,iVar10,0x21,0x21,1);
  fVar12 = -1.0;
  lVar5 = 0;
  do {
    lVar4 = -0x1104;
    iVar11 = iVar10;
    do {
      fVar1 = *(float *)((long)pfVar6 + lVar4 + 0x1104);
      if (fVar12 < fVar1) {
        fVar12 = fVar1;
        dst.x = (int)lVar5 + x_00;
        dst.z = iVar11;
      }
      iVar11 = iVar11 + 1;
      lVar4 = lVar4 + 0x84;
    } while (lVar4 != 0);
    lVar5 = lVar5 + 1;
    pfVar6 = pfVar6 + 1;
  } while (lVar5 != 0x21);
  PVar2.z = dst.z;
  PVar2.x = dst.x;
  return PVar2;
}

Assistant:

Pos getLinkedGatewayPos(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed, Pos src)
{
    float y[33*33]; // buffer for [16][16] and [33][33]
    int ymin = 0;
    int i, j;

    Pos dst;
    Pos c = getLinkedGatewayChunk(en, sn, seed, src, &dst);

    if (en->mc > MC_1_16)
    {
        // The original java implementation has a bug where the result
        // variable for the in-chunk block search is assigned a reference
        // to the mutable iterator, which ends up as the last iteration
        // position and discards the found location.
        dst.x = c.x * 16 + 15;
        dst.z = c.z * 16 + 15;
    }
    else
    {
        mapEndSurfaceHeight(y, en, sn, c.x*16, c.z*16, 16, 16, 1, 30);
        mapEndIslandHeight(y, en, seed, c.x*16, c.z*16, 16, 16, 1);

        uint64_t d = 0;
        for (j = 0; j < 16; j++)
        {
            for (i = 0; i < 16; i++)
            {
                int v = (int) y[j*16 + i];
                if (v < 30) continue;
                uint64_t dx = 16*c.x + i;
                uint64_t dz = 16*c.z + j;
                uint64_t dr = dx*dx + dz*dz + v*v;
                if (dr > d)
                {
                    d = dr;
                    dst.x = dx;
                    dst.z = dz;
                }
            }
        }
        // use the previous result to retrieve the minimum y-level we know,
        // we can skip generation of surfaces that are lower than this
        for (i = 0; i < 16*16; i++)
            if (y[i] > ymin)
                ymin = (int) floor(y[i]);
    }

    Pos sp = { dst.x-16, dst.z-16 };
    // checking end islands is much cheaper than surface height generation, so
    // we can also skip surface generation lower than the highest island around
    memset(y, 0, sizeof(float)*33*33);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);
    for (i = 0; i < 33*33; i++)
        if (y[i] > ymin)
            ymin = (int) floor(y[i]);

    mapEndSurfaceHeight(y, en, sn, sp.x, sp.z, 33, 33, 1, ymin);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);

    float v = -1;
    for (i = 0; i < 33; i++)
    {
        for (j = 0; j < 33; j++)
        {
            if (y[j*33 + i] <= v)
                continue;
            v = y[j*33 + i];
            dst.x = sp.x + i;
            dst.z = sp.z + j;
        }
    }

    return dst;
}